

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O1

bool __thiscall
XmlModelSerialiserPrivate::readXml(XmlModelSerialiserPrivate *this,QXmlStreamReader *reader)

{
  QAbstractItemModel *pQVar1;
  char cVar2;
  bool bVar3;
  byte bVar4;
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  long extraout_RDX;
  long extraout_RDX_00;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  undefined1 auVar27 [16];
  QVariant roleVariant;
  QXmlStreamAttributes headDataAttribute;
  undefined1 local_c8 [36];
  undefined4 local_a4;
  QArrayDataPointer<QXmlStreamAttribute> local_a0;
  QArrayData *local_88;
  char16_t *local_80;
  undefined8 local_78;
  QArrayData *local_70;
  char16_t *local_68;
  undefined8 local_60;
  long local_58;
  long local_50;
  QString local_48;
  
  pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
           m_model;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
LAB_0012bf7a:
    bVar9 = false;
  }
  else {
    local_c8._0_8_ = -NAN;
    local_c8._8_8_ = 0;
    local_c8._16_8_ = (QAbstractItemModel *)0x0;
    uVar5 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_c8);
    local_a0.d = (Data *)0xffffffffffffffff;
    local_a0.ptr = (QXmlStreamAttribute *)0x0;
    local_a0.size = 0;
    (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,uVar5,&local_a0);
    pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
             m_model;
    local_c8._0_8_ = (QArrayData *)0xffffffffffffffff;
    local_c8._8_8_ = (char16_t *)0x0;
    local_c8._16_8_ = (QAbstractItemModel *)0x0;
    uVar5 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_c8);
    local_a0.d = (Data *)0xffffffffffffffff;
    local_a0.ptr = (QXmlStreamAttribute *)0x0;
    local_a0.size = 0;
    (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,uVar5,&local_a0);
    cVar2 = QXmlStreamReader::atEnd();
    if (cVar2 == '\0') {
      bVar8 = 0;
      bVar9 = false;
      bVar10 = false;
      do {
        iVar6 = QXmlStreamReader::error();
        if (iVar6 != 0) break;
        QXmlStreamReader::readNext();
        iVar6 = QXmlStreamReader::tokenType();
        if (iVar6 == 4) {
          auVar27 = QXmlStreamReader::name();
          if ((auVar27._0_8_ == 7) &&
             (QVar11.m_data = auVar27._8_8_, QVar11.m_size = 7, QVar19.m_data = L"Element",
             QVar19.m_size = 7, cVar2 = QtPrivate::equalStrings(QVar11,QVar19), cVar2 != '\0')) {
            local_c8._0_8_ = (QArrayData *)0xffffffffffffffff;
            local_c8._8_8_ = (char16_t *)0x0;
            local_c8._16_8_ = (QAbstractItemModel *)0x0;
            bVar3 = readXmlElement(this,reader,(QModelIndex *)local_c8);
            if (!bVar3) goto LAB_0012bed7;
          }
          else {
            auVar27 = QXmlStreamReader::name();
            if ((auVar27._0_8_ == 10) &&
               (QVar12.m_data = auVar27._8_8_, QVar12.m_size = 10, QVar21.m_data = L"HeaderData",
               QVar21.m_size = 10, cVar2 = QtPrivate::equalStrings(QVar12,QVar21), cVar2 != '\0')) {
              bVar8 = 1;
            }
            else {
              auVar27 = QXmlStreamReader::name();
              if (auVar27._0_8_ == 8) {
                QVar13.m_data = auVar27._8_8_;
                QVar13.m_size = 8;
                QVar22.m_data = L"Vertical";
                QVar22.m_size = 8;
                bVar4 = QtPrivate::equalStrings(QVar13,QVar22);
              }
              else {
                bVar4 = 0;
              }
              if ((bVar4 & bVar8) == 1) {
                bVar10 = true;
                if (bVar9) goto LAB_0012bf7a;
              }
              else {
                auVar27 = QXmlStreamReader::name();
                if ((auVar27._0_8_ == 10) &&
                   (QVar15.m_data = auVar27._8_8_, QVar15.m_size = 10, QVar24.m_data = L"Horizontal"
                   , QVar24.m_size = 10, bVar4 = QtPrivate::equalStrings(QVar15,QVar24),
                   (bVar4 & bVar8) == 1)) {
                  bVar9 = true;
                  if (bVar10) goto LAB_0012bf7a;
                }
                else {
                  auVar27 = QXmlStreamReader::name();
                  if ((auVar27._0_8_ == 0xf) &&
                     (QVar16.m_data = auVar27._8_8_, QVar16.m_size = 0xf,
                     QVar25.m_data = L"HeaderDataPoint", QVar25.m_size = 0xf,
                     bVar4 = QtPrivate::equalStrings(QVar16,QVar25), (bVar4 & bVar8) == 1)) {
                    if ((bVar10 == false) && (!bVar9)) goto LAB_0012bf7a;
                    QXmlStreamReader::attributes();
                    local_c8._0_8_ = (QArrayData *)0x0;
                    local_c8._8_8_ = L"Section";
                    local_c8._16_8_ = (QAbstractItemModel *)0x7;
                    QXmlStreamAttributes::value((QString *)&local_a0);
                    if (extraout_RDX == 0) {
LAB_0012bc2f:
                      bVar3 = false;
                      local_a4 = 0;
                    }
                    else {
                      local_70 = (QArrayData *)0x0;
                      local_68 = L"Role";
                      local_60 = 4;
                      QXmlStreamAttributes::value((QString *)&local_a0);
                      if (extraout_RDX_00 == 0) goto LAB_0012bc2f;
                      local_88 = (QArrayData *)0x0;
                      local_80 = L"Type";
                      local_78 = 4;
                      auVar27 = QXmlStreamAttributes::value((QString *)&local_a0);
                      local_a4 = (undefined4)CONCAT71(auVar27._1_7_,auVar27._8_8_ != 0);
                      bVar3 = true;
                    }
                    if ((bVar3) && (local_88 != (QArrayData *)0x0)) {
                      LOCK();
                      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_88,2,8);
                      }
                    }
                    if ((extraout_RDX != 0) && (local_70 != (QArrayData *)0x0)) {
                      LOCK();
                      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_70,2,8);
                      }
                    }
                    if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_c8._0_8_ = *(int *)local_c8._0_8_ + -1;
                      UNLOCK();
                      if (*(int *)local_c8._0_8_ == 0) {
                        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,8);
                      }
                    }
                    if ((char)local_a4 == '\0') {
                      QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_a0);
                      goto LAB_0012bf7a;
                    }
                    local_c8._0_8_ = (QArrayData *)0x0;
                    local_c8._8_8_ = L"Section";
                    local_c8._16_8_ = (QAbstractItemModel *)0x7;
                    QVar18 = (QStringView)QXmlStreamAttributes::value((QString *)&local_a0);
                    local_50 = QString::toIntegral_helper(QVar18,(bool *)0x0,10);
                    if ((int)local_50 != local_50) {
                      local_50 = 0;
                    }
                    if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_c8._0_8_ = *(int *)local_c8._0_8_ + -1;
                      UNLOCK();
                      if (*(int *)local_c8._0_8_ == 0) {
                        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,8);
                      }
                    }
                    local_c8._0_8_ = (QArrayData *)0x0;
                    local_c8._8_8_ = L"Role";
                    local_c8._16_8_ = (QAbstractItemModel *)0x4;
                    QVar18 = (QStringView)QXmlStreamAttributes::value((QString *)&local_a0);
                    local_58 = QString::toIntegral_helper(QVar18,(bool *)0x0,10);
                    if ((int)local_58 != local_58) {
                      local_58 = 0;
                    }
                    if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_c8._0_8_ = *(int *)local_c8._0_8_ + -1;
                      UNLOCK();
                      if (*(int *)local_c8._0_8_ == 0) {
                        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,8);
                      }
                    }
                    local_c8._0_8_ = (QArrayData *)0x0;
                    local_c8._8_8_ = L"Type";
                    local_c8._16_8_ = (QAbstractItemModel *)0x4;
                    QVar18 = (QStringView)QXmlStreamAttributes::value((QString *)&local_a0);
                    lVar7 = QString::toIntegral_helper(QVar18,(bool *)0x0,10);
                    if ((int)lVar7 != lVar7) {
                      lVar7 = 0;
                    }
                    if ((QArrayData *)local_c8._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      *(int *)local_c8._0_8_ = *(int *)local_c8._0_8_ + -1;
                      UNLOCK();
                      if (*(int *)local_c8._0_8_ == 0) {
                        QArrayData::deallocate((QArrayData *)local_c8._0_8_,2,8);
                      }
                    }
                    QXmlStreamReader::readElementText(&local_48,reader,0);
                    AbstractStringSerialiserPrivate::loadVariant
                              ((QVariant *)local_c8,&this->super_AbstractStringSerialiserPrivate,
                               (int)lVar7,&local_48);
                    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_48.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
                      }
                    }
                    cVar2 = ::QVariant::isNull();
                    if (cVar2 == '\0') {
                      pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                               super_AbstractModelSerialiserPrivate.m_model;
                      (**(code **)(*(long *)pQVar1 + 0xa8))
                                (pQVar1,local_50,bVar10 + '\x01',local_c8,local_58);
                    }
                    ::QVariant::~QVariant((QVariant *)local_c8);
                    QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_a0);
                    if ((char)local_a4 == '\0') goto LAB_0012bf7a;
                  }
                }
              }
            }
          }
        }
        else {
          iVar6 = QXmlStreamReader::tokenType();
          if (iVar6 == 5) {
            auVar27 = QXmlStreamReader::name();
            if ((auVar27._0_8_ == 10) &&
               (QVar18.m_data = auVar27._8_8_, QVar18.m_size = 10, QVar20.m_data = L"HeaderData",
               QVar20.m_size = 10, cVar2 = QtPrivate::equalStrings(QVar18,QVar20), cVar2 != '\0')) {
              bVar8 = 0;
            }
            else {
              auVar27 = QXmlStreamReader::name();
              if (auVar27._0_8_ == 8) {
                QVar14.m_data = auVar27._8_8_;
                QVar14.m_size = 8;
                QVar23.m_data = L"Vertical";
                QVar23.m_size = 8;
                bVar4 = QtPrivate::equalStrings(QVar14,QVar23);
              }
              else {
                bVar4 = 0;
              }
              if ((bVar4 & bVar8) == 0) {
                auVar27 = QXmlStreamReader::name();
                if ((auVar27._0_8_ == 10) &&
                   (QVar17.m_data = auVar27._8_8_, QVar17.m_size = 10, QVar26.m_data = L"Horizontal"
                   , QVar26.m_size = 10, bVar4 = QtPrivate::equalStrings(QVar17,QVar26),
                   (bVar4 & bVar8) != 0)) {
                  bVar9 = false;
                }
              }
              else {
                bVar10 = false;
              }
            }
          }
        }
        cVar2 = QXmlStreamReader::atEnd();
      } while (cVar2 == '\0');
    }
    iVar6 = QXmlStreamReader::error();
    if (iVar6 == 0) {
      bVar9 = true;
    }
    else {
LAB_0012bed7:
      pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
               m_model;
      local_c8._0_8_ = -NAN;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = (QAbstractItemModel *)0x0;
      uVar5 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_c8);
      local_a0.d = (Data *)0xffffffffffffffff;
      local_a0.ptr = (QXmlStreamAttribute *)0x0;
      local_a0.size = 0;
      bVar9 = false;
      (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,uVar5,&local_a0);
      pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
               m_model;
      local_c8._0_8_ = -NAN;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = (QAbstractItemModel *)0x0;
      uVar5 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,local_c8);
      local_a0.d = (Data *)0xffffffffffffffff;
      local_a0.ptr = (QXmlStreamAttribute *)0x0;
      local_a0.size = 0;
      (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,uVar5,&local_a0);
    }
  }
  return bVar9;
}

Assistant:

bool XmlModelSerialiserPrivate::readXml(QXmlStreamReader &reader)
{
    if (!m_model)
        return false;
    m_model->removeColumns(0, m_model->columnCount());
    m_model->removeRows(0, m_model->rowCount());
    bool headerDataStarted = false;
    bool hHeaderDataStarted = false;
    bool vHeaderDataStarted = false;
    while (!reader.atEnd() && !reader.hasError()) {
        reader.readNext();
        if (reader.isStartElement()) {
            if (reader.name() == QStringLiteral("Element")) {
                if (!readXmlElement(reader)) {
                    m_model->removeColumns(0, m_model->columnCount());
                    m_model->removeRows(0, m_model->rowCount());
                    return false;
                }
            } else if (reader.name() == QStringLiteral("HeaderData")) {
                headerDataStarted = true;
            } else if (reader.name() == QStringLiteral("Vertical") && headerDataStarted) {
                if (hHeaderDataStarted)
                    return false;
                vHeaderDataStarted = true;
            } else if (reader.name() == QStringLiteral("Horizontal") && headerDataStarted) {
                if (vHeaderDataStarted)
                    return false;
                hHeaderDataStarted = true;
            } else if (reader.name() == QStringLiteral("HeaderDataPoint") && headerDataStarted) {
                if (!(vHeaderDataStarted || hHeaderDataStarted))
                    return false;
                const QXmlStreamAttributes headDataAttribute = reader.attributes();
                if (!(headDataAttribute.hasAttribute(QStringLiteral("Section")) && headDataAttribute.hasAttribute(QStringLiteral("Role"))
                      && headDataAttribute.hasAttribute(QStringLiteral("Type"))))
                    return false;
                int headerSection = headDataAttribute.value(QStringLiteral("Section")).toInt();
                int headerRole = headDataAttribute.value(QStringLiteral("Role")).toInt();
                int headerType = headDataAttribute.value(QStringLiteral("Type")).toInt();
                const QVariant roleVariant = loadVariant(headerType, reader.readElementText());
                if (!roleVariant.isNull()) // skip unhandled types
                    m_model->setHeaderData(headerSection, (vHeaderDataStarted ? Qt::Vertical : Qt::Horizontal), roleVariant, headerRole);
            }

        } else if (reader.isEndElement()) {
            if (reader.name() == QStringLiteral("HeaderData")) {
                headerDataStarted = false;
            } else if (reader.name() == QStringLiteral("Vertical") && headerDataStarted) {
                vHeaderDataStarted = false;
            } else if (reader.name() == QStringLiteral("Horizontal") && headerDataStarted) {
                hHeaderDataStarted = false;
            }
        }
    }
    if (reader.hasError()) {
        m_model->removeColumns(0, m_model->columnCount());
        m_model->removeRows(0, m_model->rowCount());
        return false;
    }
    return true;
}